

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c2mir.c
# Opt level: O1

op_t * force_reg_or_mem(op_t *__return_storage_ptr__,c2m_ctx_t c2m_ctx,op_t op,MIR_type_t t)

{
  if ((byte)op.mir_op._8_1_ - 8 < 2) {
    force_reg(__return_storage_ptr__,c2m_ctx,op,MIR_T_I64);
  }
  else {
    if ((op.mir_op._8_1_ != '\n') && (op.mir_op._8_1_ != '\x01')) {
      __assert_fail("op.mir_op.mode == MIR_OP_REF || op.mir_op.mode == MIR_OP_STR",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/c2mir/c2mir.c"
                    ,0x2ae7,"op_t force_reg_or_mem(c2m_ctx_t, op_t, MIR_type_t)");
    }
    __return_storage_ptr__->decl = op.decl;
    *(undefined8 *)&__return_storage_ptr__->field_0x8 = op._8_8_;
    (__return_storage_ptr__->mir_op).data = op.mir_op.data;
    *(long *)&(__return_storage_ptr__->mir_op).field_0x8 = op.mir_op._8_8_;
    (__return_storage_ptr__->mir_op).u.i = op.mir_op.u.i;
    (__return_storage_ptr__->mir_op).u.str.s = op.mir_op.u.str.s;
    *(undefined8 *)((long)&(__return_storage_ptr__->mir_op).u + 0x10) = op.mir_op.u._16_8_;
    (__return_storage_ptr__->mir_op).u.mem.disp = op.mir_op.u.mem.disp;
  }
  return __return_storage_ptr__;
}

Assistant:

static op_t force_reg_or_mem (c2m_ctx_t c2m_ctx, op_t op, MIR_type_t t) {
  if (op.mir_op.mode == MIR_OP_REG || op.mir_op.mode == MIR_OP_MEM) return op;
  assert (op.mir_op.mode == MIR_OP_REF || op.mir_op.mode == MIR_OP_STR);
  return force_reg (c2m_ctx, op, t);
}